

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O2

void __thiscall LogFile::Start_Log(LogFile *this)

{
  ostream *poVar1;
  pthread_t Swap_thread;
  pthread_t Write_thread;
  pthread_t local_28;
  pthread_t local_20;
  
  pthread_create(&local_28,(pthread_attr_t *)0x0,LogSwapStart,this);
  pthread_setname_np(local_28,"LogSwapThread");
  poVar1 = std::operator<<((ostream *)&std::cout,"LogSwapThread Start");
  std::endl<char,std::char_traits<char>>(poVar1);
  pthread_create(&local_20,(pthread_attr_t *)0x0,LogWriteStart,this);
  pthread_setname_np(local_20,"LogWriteThread");
  poVar1 = std::operator<<((ostream *)&std::cout,"LogWriteThread Start");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void LogFile::Start_Log()
{
    pthread_t Write_thread;
    pthread_t Swap_thread;
    pthread_create(&Swap_thread,NULL,&LogSwapStart,this);
    pthread_setname_np(Swap_thread,"LogSwapThread");
    cout<<"LogSwapThread Start"<<endl;
    pthread_create(&Write_thread,NULL,&LogWriteStart,this);
    pthread_setname_np(Write_thread,"LogWriteThread");
    cout<<"LogWriteThread Start"<<endl;
}